

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.cpp
# Opt level: O3

int main(void)

{
  Unused *this;
  Unused ob2;
  Unused local_11;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  Unused::Unused(&local_11);
  this = (Unused *)operator_new(1);
  Unused::Unused(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"This fall through is intentional.\n",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
	std::cout << std::endl;
	// [[maybe_unused]]
	Unused ob2; //Stack
	Unused *ob1 = new Unused(); //Heap

	// [[nodiscard]]
	nodiscard_eg();

	//[[fallthrough]]
	switch (1) {
		case 1:
			std::cout << "This fall through is intentional.\n" << std::endl;
			[[fallthrough]];
		case 2:
			break;
	}
}